

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::MultiPartInputFile::Data::readChunkOffsetTables
          (Data *this,bool reconstructChunkOffsetTable)

{
  bool bVar1;
  int iVar2;
  Header *pHVar3;
  reference ppIVar4;
  reference pvVar5;
  byte in_SIL;
  long in_RDI;
  int j_1;
  int j;
  int chunkOffsetTableSize;
  size_t i;
  bool brokenPartsExist;
  vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *in_stack_00000260;
  IStream *in_stack_00000268;
  Data *in_stack_00000270;
  unsigned_long *in_stack_ffffffffffffffb8;
  IStream *in_stack_ffffffffffffffc0;
  Header *header;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  Header *local_18;
  
  bVar1 = false;
  local_18 = (Header *)0x0;
  do {
    header = local_18;
    pHVar3 = (Header *)
             std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::size
                       ((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                         *)(in_RDI + 0x40));
    if (pHVar3 <= header) {
      if ((bVar1) && ((in_SIL & 1) != 0)) {
        chunkOffsetReconstruction(in_stack_00000270,in_stack_00000268,in_stack_00000260);
      }
      return;
    }
    std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::operator[]
              ((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *)
               (in_RDI + 0x40),(size_type)local_18);
    iVar2 = getChunkOffsetTableSize(header,SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
    std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::operator[]
              ((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *)
               (in_RDI + 0x40),(size_type)local_18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    for (in_stack_ffffffffffffffe0 = 0; in_stack_ffffffffffffffe0 < iVar2;
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
      in_stack_ffffffffffffffc0 = *(IStream **)(in_RDI + 0x28);
      ppIVar4 = std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::
                operator[]((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                            *)(in_RDI + 0x40),(size_type)local_18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (&(*ppIVar4)->chunkOffsets,(long)in_stack_ffffffffffffffe0);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    ppIVar4 = std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::
              operator[]((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                          *)(in_RDI + 0x40),(size_type)local_18);
    (*ppIVar4)->completed = true;
    for (in_stack_ffffffffffffffdc = 0; in_stack_ffffffffffffffdc < iVar2;
        in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
      ppIVar4 = std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::
                operator[]((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                            *)(in_RDI + 0x40),(size_type)local_18);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&(*ppIVar4)->chunkOffsets,(long)in_stack_ffffffffffffffdc);
      if (*pvVar5 == 0) {
        bVar1 = true;
        ppIVar4 = std::vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>::
                  operator[]((vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                              *)(in_RDI + 0x40),(size_type)local_18);
        (*ppIVar4)->completed = false;
        break;
      }
    }
    local_18 = (Header *)&(local_18->_map)._M_t._M_impl.field_0x1;
  } while( true );
}

Assistant:

void
MultiPartInputFile::Data::readChunkOffsetTables(bool reconstructChunkOffsetTable)
{
    bool brokenPartsExist = false;

    for (size_t i = 0; i < parts.size(); i++)
    {
        int chunkOffsetTableSize = getChunkOffsetTableSize(parts[i]->header);
        parts[i]->chunkOffsets.resize(chunkOffsetTableSize);

        for (int j = 0; j < chunkOffsetTableSize; j++)
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*is, parts[i]->chunkOffsets[j]);

        //
        // Check chunk offsets, reconstruct if broken.
        // At first we assume the table is complete.
        //
        parts[i]->completed = true;
        for (int j = 0; j < chunkOffsetTableSize; j++)
        {
            if (parts[i]->chunkOffsets[j] <= 0)
            {
                brokenPartsExist = true;
                parts[i]->completed = false;
                break;
            }
        }
    }

    if (brokenPartsExist && reconstructChunkOffsetTable)
        chunkOffsetReconstruction(*is, parts);
}